

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

void render_symbol(element_t *element,render_context_t *context,render_state_t *state,float x,
                  float y,float width,float height)

{
  plutovg_matrix_t *matrix;
  bool bVar1;
  float fVar2;
  float fVar3;
  _Bool _Var4;
  plutovg_rect_t *view_box_00;
  view_position_t *position_00;
  element *element_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float sx;
  plutovg_rect_t view_box;
  view_position_t position;
  render_state_t new_state;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_70;
  render_state_t local_68;
  
  if (width <= 0.0) {
    return;
  }
  if (height <= 0.0) {
    return;
  }
  _Var4 = is_display_none(element);
  if (_Var4) {
    return;
  }
  render_state_begin(element,&local_68,state);
  matrix = &local_68.matrix;
  local_68.view_width = width;
  local_68.view_height = height;
  plutovg_matrix_translate(matrix,x,y);
  local_88 = 0;
  uStack_80 = 0;
  _Var4 = parse_view_box(local_68.element,(int)&local_88,view_box_00);
  if (!_Var4) goto LAB_00106fc5;
  local_70 = 5;
  parse_view_position(local_68.element,(int)&local_70,position_00);
  fVar2 = (float)uStack_80;
  fVar3 = uStack_80._4_4_;
  sx = width / (float)uStack_80;
  fVar5 = height / uStack_80._4_4_;
  if ((uint)local_70 == 0) {
    plutovg_matrix_scale(matrix,sx,fVar5);
    plutovg_matrix_translate(matrix,-(float)local_88,-local_88._4_4_);
  }
  else {
    bVar1 = fVar5 < sx;
    if (local_70._4_4_ == 0) {
      bVar1 = sx < fVar5;
    }
    if (!bVar1) {
      sx = fVar5;
    }
    fVar5 = -(float)local_88 * sx;
    if ((uint)local_70 < 10) {
      if ((0x124U >> ((uint)local_70 & 0x1f) & 1) == 0) {
        if ((0x248U >> ((uint)local_70 & 0x1f) & 1) == 0) goto LAB_00106f5d;
        fVar7 = width - (float)uStack_80 * sx;
      }
      else {
        fVar7 = (width - (float)uStack_80 * sx) * 0.5;
      }
      fVar5 = fVar5 + fVar7;
    }
LAB_00106f5d:
    fVar7 = -local_88._4_4_ * sx;
    if ((uint)local_70 - 7 < 3) {
      fVar6 = height - uStack_80._4_4_ * sx;
LAB_00106f90:
      fVar7 = fVar7 + fVar6;
    }
    else if ((uint)local_70 - 4 < 3) {
      fVar6 = (height - uStack_80._4_4_ * sx) * 0.5;
      goto LAB_00106f90;
    }
    plutovg_matrix_translate(matrix,fVar5,fVar7);
    plutovg_matrix_scale(matrix,sx,sx);
  }
  local_68.view_width = fVar2;
  local_68.view_height = fVar3;
LAB_00106fc5:
  element_00 = element->first_child;
  if (element_00 != (element *)0x0) {
    do {
      render_element(element_00,context,&local_68);
      element_00 = element_00->next_sibling;
    } while (element_00 != (element *)0x0);
  }
  render_state_end(&local_68);
  return;
}

Assistant:

static void render_symbol(const element_t* element, const render_context_t* context, render_state_t* state, float x, float y, float width, float height)
{
    if(width <= 0.f || height <= 0.f || is_display_none(element))
        return;
    render_state_t new_state;
    render_state_begin(element, &new_state, state);

    new_state.view_width = width;
    new_state.view_height = height;
    plutovg_matrix_translate(&new_state.matrix, x, y);

    apply_view_transform(&new_state, width, height);
    render_children(element, context, &new_state);
    render_state_end(&new_state);
}